

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall
QTabBarPrivate::initBasicStyleOption(QTabBarPrivate *this,QStyleOptionTab *option,int tabIndex)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  QFlagsStorage<QStyle::StateFlag> mask;
  qsizetype qVar4;
  const_reference ppTVar5;
  QSize QVar6;
  QTabWidget *pQVar7;
  QWidget *pQVar8;
  int in_EDX;
  QWidget *in_RSI;
  QTabBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar9;
  QTabWidget *tw;
  bool paintEnd;
  bool paintBeginning;
  bool isCurrent;
  Tab *tab;
  int totalTabs;
  QTabBar *q;
  undefined4 in_stack_ffffffffffffff68;
  ColorRole in_stack_ffffffffffffff6c;
  enum_type in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 uVar10;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 uVar11;
  QWidget *in_stack_ffffffffffffff78;
  QStyleOption *in_stack_ffffffffffffff88;
  Tab *this_00;
  QSize local_34;
  QSize local_2c;
  undefined8 local_1c;
  undefined8 local_14;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  qVar4 = QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList);
  if (((in_RSI != (QWidget *)0x0) && (-1 < in_EDX)) && (in_EDX < (int)qVar4)) {
    ppTVar5 = QList<QTabBarPrivate::Tab_*>::at
                        ((QList<QTabBarPrivate::Tab_*> *)
                         CONCAT17(in_stack_ffffffffffffff77,
                                  CONCAT16(in_stack_ffffffffffffff76,
                                           CONCAT15(in_stack_ffffffffffffff75,
                                                    CONCAT14(in_stack_ffffffffffffff74,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    this_00 = *ppTVar5;
    QStyleOption::initFrom(in_stack_ffffffffffffff88,(QWidget *)in_RDI);
    ::operator|(CONCAT13(in_stack_ffffffffffffff77,
                         CONCAT12(in_stack_ffffffffffffff76,
                                  CONCAT11(in_stack_ffffffffffffff75,in_stack_ffffffffffffff74))),
                in_stack_ffffffffffffff70);
    mask.i = (Int)QFlags<QStyle::StateFlag>::operator~
                            ((QFlags<QStyle::StateFlag> *)
                             CONCAT17(in_stack_ffffffffffffff77,
                                      CONCAT16(in_stack_ffffffffffffff76,
                                               CONCAT15(in_stack_ffffffffffffff75,
                                                        CONCAT14(in_stack_ffffffffffffff74,
                                                                 in_stack_ffffffffffffff70)))));
    QFlags<QStyle::StateFlag>::operator&=
              ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,(QFlags<QStyle::StateFlag>)mask.i);
    QVar9 = QTabBar::tabRect((QTabBar *)this_00,mask.i);
    local_1c = QVar9._0_8_;
    *(undefined8 *)&in_RSI->super_QPaintDevice = local_1c;
    local_14 = QVar9._8_8_;
    *(undefined8 *)&in_RSI->field_0x18 = local_14;
    iVar1 = in_RDI->currentIndex;
    *(undefined4 *)&in_RSI[2].field_0x18 = 0;
    if (in_EDX == in_RDI->pressedIndex) {
      QFlags<QStyle::StateFlag>::operator|=
                ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_Sunken);
    }
    if (in_EDX == iVar1) {
      QFlags<QStyle::StateFlag>::operator|=
                ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_Selected);
      bVar3 = QWidget::hasFocus((QWidget *)in_stack_ffffffffffffff88);
      if (bVar3) {
        QFlags<QStyle::StateFlag>::operator|=
                  ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_HasFocus);
      }
    }
    if ((this_00->field_0xe4 & 1) == 0) {
      QFlags<QStyle::StateFlag>::operator&=((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,-2);
    }
    bVar3 = QWidget::isActiveWindow(in_RSI);
    if (bVar3) {
      QFlags<QStyle::StateFlag>::operator|=
                ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_Active);
    }
    if (((*(ushort *)&in_RDI->field_0x2d0 >> 9 & 1) == 0) &&
       (bVar3 = ::operator==((QRect *)CONCAT17(in_stack_ffffffffffffff77,
                                               CONCAT16(in_stack_ffffffffffffff76,
                                                        CONCAT15(in_stack_ffffffffffffff75,
                                                                 CONCAT14(in_stack_ffffffffffffff74,
                                                                          in_stack_ffffffffffffff70)
                                                                ))),
                             (QRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
       , bVar3)) {
      QFlags<QStyle::StateFlag>::operator|=
                ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_MouseOver);
    }
    *(Shape *)&in_RSI[1].field_0x18 = in_RDI->shape;
    QString::operator=((QString *)&in_RSI[1].data,(QString *)this_00);
    bVar3 = QColor::isValid(&this_00->textColor);
    if (bVar3) {
      in_stack_ffffffffffffff78 = in_RSI + 1;
      QWidget::foregroundRole((QWidget *)in_stack_ffffffffffffff88);
      QPalette::setColor((QPalette *)
                         CONCAT17(in_stack_ffffffffffffff77,
                                  CONCAT16(in_stack_ffffffffffffff76,
                                           CONCAT15(in_stack_ffffffffffffff75,
                                                    CONCAT14(in_stack_ffffffffffffff74,
                                                             in_stack_ffffffffffffff70)))),
                         in_stack_ffffffffffffff6c,(QColor *)0x6a89d7);
    }
    QIcon::operator=((QIcon *)&in_RSI[2].super_QPaintDevice,(QIcon *)&this_00->icon);
    QVar6 = QTabBar::iconSize((QTabBar *)in_RDI);
    *(QSize *)(in_RSI + 3) = QVar6;
    if (this_00->leftWidget == (QWidget *)0x0) {
      QSize::QSize((QSize *)CONCAT17(in_stack_ffffffffffffff77,
                                     CONCAT16(in_stack_ffffffffffffff76,
                                              CONCAT15(in_stack_ffffffffffffff75,
                                                       CONCAT14(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70)))));
    }
    else {
      local_2c = QWidget::size((QWidget *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    *(QSize *)&in_RSI[3].field_0xc = local_2c;
    if (this_00->rightWidget == (QWidget *)0x0) {
      QSize::QSize((QSize *)CONCAT17(in_stack_ffffffffffffff77,
                                     CONCAT16(in_stack_ffffffffffffff76,
                                              CONCAT15(in_stack_ffffffffffffff75,
                                                       CONCAT14(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70)))));
    }
    else {
      local_34 = QWidget::size((QWidget *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    *(int *)&in_RSI[3].field_0x14 = local_34.wd.m_i;
    *(int *)&in_RSI[3].field_0x18 = local_34.ht.m_i;
    in_RSI[3].field_0x8 = (byte)((ushort)*(undefined2 *)&in_RDI->field_0x2d0 >> 10) & 1;
    if ((in_EDX < 1) || (in_EDX + -1 != in_RDI->currentIndex)) {
      if ((in_EDX + 1 < (int)qVar4) && (in_EDX + 1 == in_RDI->currentIndex)) {
        *(undefined4 *)&in_RSI[2].data = 1;
      }
      else {
        *(undefined4 *)&in_RSI[2].data = 0;
      }
    }
    else {
      *(undefined4 *)&in_RSI[2].data = 2;
    }
    uVar11 = true;
    if ((in_EDX != in_RDI->firstVisible) &&
       (in_stack_ffffffffffffff76 = false, uVar11 = in_stack_ffffffffffffff76,
       (*(ushort *)&in_RDI->field_0x2d0 >> 9 & 1) != 0)) {
      in_stack_ffffffffffffff76 = in_EDX == in_RDI->pressedIndex + 1;
      uVar11 = in_stack_ffffffffffffff76;
    }
    uVar10 = true;
    if ((in_EDX != in_RDI->lastVisible) &&
       (in_stack_ffffffffffffff74 = false, uVar10 = in_stack_ffffffffffffff74,
       (*(ushort *)&in_RDI->field_0x2d0 >> 9 & 1) != 0)) {
      in_stack_ffffffffffffff74 = in_EDX == in_RDI->pressedIndex + -1;
      uVar10 = in_stack_ffffffffffffff74;
    }
    if ((bool)uVar11 == false) {
      if ((bool)uVar10 == false) {
        *(undefined4 *)&in_RSI[2].field_0x1c = 1;
      }
      else {
        *(undefined4 *)&in_RSI[2].field_0x1c = 2;
      }
    }
    else if ((bool)uVar10 == false) {
      *(undefined4 *)&in_RSI[2].field_0x1c = 0;
    }
    else {
      *(undefined4 *)&in_RSI[2].field_0x1c = 3;
    }
    QWidget::parentWidget((QWidget *)0x6a8c3a);
    pQVar7 = qobject_cast<QTabWidget_const*>((QObject *)0x6a8c42);
    if (pQVar7 != (QTabWidget *)0x0) {
      QFlags<QStyleOptionTab::TabFeature>::operator|=
                ((QFlags<QStyleOptionTab::TabFeature> *)&in_RSI[3].field_0x1c,HasFrame);
      pQVar8 = QTabWidget::cornerWidget
                         ((QTabWidget *)in_stack_ffffffffffffff78,
                          CONCAT13(uVar11,CONCAT12(in_stack_ffffffffffffff76,
                                                   CONCAT11(uVar10,in_stack_ffffffffffffff74))));
      if ((pQVar8 != (QWidget *)0x0) ||
         (pQVar8 = QTabWidget::cornerWidget
                             ((QTabWidget *)in_stack_ffffffffffffff78,
                              CONCAT13(uVar11,CONCAT12(in_stack_ffffffffffffff76,
                                                       CONCAT11(uVar10,in_stack_ffffffffffffff74))))
         , pQVar8 != (QWidget *)0x0)) {
        QFlags<QStyleOptionTab::CornerWidget>::operator|=
                  ((QFlags<QStyleOptionTab::CornerWidget> *)((long)&in_RSI[2].data + 4),
                   LeftCornerWidget);
      }
      pQVar8 = QTabWidget::cornerWidget
                         ((QTabWidget *)in_stack_ffffffffffffff78,
                          CONCAT13(uVar11,CONCAT12(in_stack_ffffffffffffff76,
                                                   CONCAT11(uVar10,in_stack_ffffffffffffff74))));
      if ((pQVar8 != (QWidget *)0x0) ||
         (pQVar8 = QTabWidget::cornerWidget
                             ((QTabWidget *)in_stack_ffffffffffffff78,
                              CONCAT13(uVar11,CONCAT12(in_stack_ffffffffffffff76,
                                                       CONCAT11(uVar10,in_stack_ffffffffffffff74))))
         , pQVar8 != (QWidget *)0x0)) {
        QFlags<QStyleOptionTab::CornerWidget>::operator|=
                  ((QFlags<QStyleOptionTab::CornerWidget> *)((long)&in_RSI[2].data + 4),
                   RightCornerWidget);
      }
    }
    if (((byte)this_00->field_0xe4 >> 2 & 1) != 0) {
      QFlags<QStyleOptionTab::TabFeature>::operator|=
                ((QFlags<QStyleOptionTab::TabFeature> *)&in_RSI[3].field_0x1c,MinimumSizeHint);
    }
    *(int *)&in_RSI[3].data = in_EDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBarPrivate::initBasicStyleOption(QStyleOptionTab *option, int tabIndex) const
{
    Q_Q(const QTabBar);
    const int totalTabs = tabList.size();

    if (!option || (tabIndex < 0 || tabIndex >= totalTabs))
        return;

    const QTabBarPrivate::Tab &tab = *tabList.at(tabIndex);
    option->initFrom(q);
    option->state &= ~(QStyle::State_HasFocus | QStyle::State_MouseOver);
    option->rect = q->tabRect(tabIndex);
    const bool isCurrent = tabIndex == currentIndex;
    option->row = 0;
    if (tabIndex == pressedIndex)
        option->state |= QStyle::State_Sunken;
    if (isCurrent)
        option->state |= QStyle::State_Selected;
    if (isCurrent && q->hasFocus())
        option->state |= QStyle::State_HasFocus;
    if (!tab.enabled)
        option->state &= ~QStyle::State_Enabled;
    if (q->isActiveWindow())
        option->state |= QStyle::State_Active;
    if (!dragInProgress && option->rect == hoverRect)
        option->state |= QStyle::State_MouseOver;
    option->shape = shape;
    option->text = tab.text;

    if (tab.textColor.isValid())
        option->palette.setColor(q->foregroundRole(), tab.textColor);
    option->icon = tab.icon;
    option->iconSize = q->iconSize();  // Will get the default value then.

    option->leftButtonSize = tab.leftWidget ? tab.leftWidget->size() : QSize();
    option->rightButtonSize = tab.rightWidget ? tab.rightWidget->size() : QSize();
    option->documentMode = documentMode;

    if (tabIndex > 0 && tabIndex - 1 == currentIndex)
        option->selectedPosition = QStyleOptionTab::PreviousIsSelected;
    else if (tabIndex + 1 < totalTabs && tabIndex + 1 == currentIndex)
        option->selectedPosition = QStyleOptionTab::NextIsSelected;
    else
        option->selectedPosition = QStyleOptionTab::NotAdjacent;

    const bool paintBeginning = (tabIndex == firstVisible) || (dragInProgress && tabIndex == pressedIndex + 1);
    const bool paintEnd = (tabIndex == lastVisible) || (dragInProgress && tabIndex == pressedIndex - 1);
    if (paintBeginning) {
        if (paintEnd)
            option->position = QStyleOptionTab::OnlyOneTab;
        else
            option->position = QStyleOptionTab::Beginning;
    } else if (paintEnd) {
        option->position = QStyleOptionTab::End;
    } else {
        option->position = QStyleOptionTab::Middle;
    }

#if QT_CONFIG(tabwidget)
    if (const QTabWidget *tw = qobject_cast<const QTabWidget *>(q->parentWidget())) {
        option->features |= QStyleOptionTab::HasFrame;
        if (tw->cornerWidget(Qt::TopLeftCorner) || tw->cornerWidget(Qt::BottomLeftCorner))
            option->cornerWidgets |= QStyleOptionTab::LeftCornerWidget;
        if (tw->cornerWidget(Qt::TopRightCorner) || tw->cornerWidget(Qt::BottomRightCorner))
            option->cornerWidgets |= QStyleOptionTab::RightCornerWidget;
    }
#endif
    if (tab.measuringMinimum)
        option->features |= QStyleOptionTab::MinimumSizeHint;
    option->tabIndex = tabIndex;
}